

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall higan::EventLoop::EventLoop(EventLoop *this)

{
  MultiplexEpoll *this_00;
  allocator<higan::Channel_*> local_1d [13];
  EventLoop *local_10;
  EventLoop *this_local;
  
  local_10 = this;
  this_00 = (MultiplexEpoll *)operator_new(0x40);
  MultiplexEpoll::MultiplexEpoll(this_00);
  std::unique_ptr<higan::MultiplexBase,std::default_delete<higan::MultiplexBase>>::
  unique_ptr<std::default_delete<higan::MultiplexBase>,void>
            ((unique_ptr<higan::MultiplexBase,std::default_delete<higan::MultiplexBase>> *)this,
             (pointer)this_00);
  std::allocator<higan::Channel_*>::allocator(local_1d);
  std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::vector
            (&this->active_channel_list_,100,local_1d);
  std::allocator<higan::Channel_*>::~allocator(local_1d);
  (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<higan::Timer,_std::allocator<higan::Timer>_>::vector(&this->timeout_timers_);
  this->handling_pending_event_ = false;
  this->looping_ = false;
  this->quit_ = false;
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&this->pending_func_queue_);
  Mutex::Mutex(&this->mutex_);
  TimerManager::TimerManager(&this->timer_manager_);
  return;
}

Assistant:

EventLoop::EventLoop():
		multiplex_base_(new MultiplexEpoll()),
		active_channel_list_(MultiplexEpoll::EPOLL_MAX_EVNETS),
		timeout_timers_(),
		handling_pending_event_(false),
		looping_(false),
		quit_(false),
		mutex_(),
		timer_manager_()
{

}